

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

uint64_t utcToFiletime(time_t t,long ns)

{
  uint64_t fileTime;
  long ns_local;
  time_t t_local;
  
  return ns / 100 + t * 10000000 + 0x19db1ded53e8000;
}

Assistant:

static uint64_t
utcToFiletime(time_t t, long ns)
{
	uint64_t fileTime;

	fileTime = t;
	fileTime *= 10000000;
	fileTime += ns / 100;
	fileTime += EPOC_TIME;
	return (fileTime);
}